

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O0

char * GetHIDCountryName(U8 countryCode)

{
  char *local_138;
  char *CountryNames [36];
  char *pcStack_10;
  U8 countryCode_local;
  
  CountryNames[0x23]._7_1_ = countryCode;
  memcpy(&local_138,&PTR_anon_var_dwarf_27f65_0018e3e0,0x120);
  if (CountryNames[0x23]._7_1_ < 0x24) {
    pcStack_10 = CountryNames[(ulong)CountryNames[0x23]._7_1_ - 1];
  }
  else {
    pcStack_10 = "Reserved";
  }
  return pcStack_10;
}

Assistant:

const char* GetHIDCountryName( U8 countryCode )
{
    const char* CountryNames[] = { "Not Supported",
                                   "Arabic",
                                   "Belgian",
                                   "Canadian-Bilingual",
                                   "Canadian-French",
                                   "Czech Republic",
                                   "Danish",
                                   "Finnish",
                                   "French",
                                   "German",
                                   "Greek",
                                   "Hebrew",
                                   "Hungary",
                                   "International (ISO)",
                                   "Italian",
                                   "Japan (Katakana)",
                                   "Korean",
                                   "Latin American",
                                   "Netherlands/Dutch",
                                   "Norwegian",
                                   "Persian (Farsi)",
                                   "Poland",
                                   "Portuguese",
                                   "Russia",
                                   "Slovakia",
                                   "Spanish",
                                   "Swedish",
                                   "Swiss/French",
                                   "Swiss/German",
                                   "Switzerland",
                                   "Taiwan",
                                   "Turkish-Q",
                                   "UK",
                                   "US",
                                   "Yugoslavia",
                                   "Turkish-F" };

    if( countryCode < sizeof( CountryNames ) / sizeof( *CountryNames ) )
        return CountryNames[ countryCode ];

    return "Reserved";
}